

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

QLayoutItem * __thiscall QDockWidgetLayout::takeAt(QDockWidgetLayout *this,int index)

{
  QLayoutItem *pQVar1;
  bool bVar2;
  QLayoutItem *in_RAX;
  pointer ppQVar3;
  int iVar4;
  ulong uVar5;
  
  if ((this->item_list).d.size == 0) {
    return (QLayoutItem *)0x0;
  }
  uVar5 = 0;
  iVar4 = 0;
  while( true ) {
    pQVar1 = (this->item_list).d.ptr[uVar5];
    if (pQVar1 == (QLayoutItem *)0x0) {
      bVar2 = false;
    }
    else if (iVar4 == index) {
      ppQVar3 = QList<QLayoutItem_*>::data(&this->item_list);
      ppQVar3[uVar5] = (QLayoutItem *)0x0;
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
      bVar2 = true;
      in_RAX = pQVar1;
    }
    else {
      iVar4 = iVar4 + 1;
      bVar2 = false;
    }
    if (bVar2) break;
    uVar5 = uVar5 + 1;
    if ((ulong)(this->item_list).d.size <= uVar5) {
      return (QLayoutItem *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

QLayoutItem *QDockWidgetLayout::takeAt(int index)
{
    int j = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == j) {
            item_list[i] = 0;
            invalidate();
            return item;
        }
        ++j;
    }
    return nullptr;
}